

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall argparse::ArgumentParser::parse_args(ArgumentParser *this,int argc,char **argv)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (argv,argv + argc,&local_28);
  parse_args_internal(this,&local_28);
  std::
  for_each<std::_Rb_tree_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,argparse::ArgumentParser::parse_args_validate()::_lambda(auto:1_const&)_1_>
            ((this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  return;
}

Assistant:

void parse_args(int argc, const char *const argv[]) {
    std::vector<std::string> arguments;
    std::copy(argv, argv + argc, std::back_inserter(arguments));
    parse_args(arguments);
  }